

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psobjs.c
# Opt level: O0

FT_Error cff_builder_start_point(CFF_Builder *builder,FT_Pos x,FT_Pos y)

{
  FT_Error local_24;
  FT_Error error;
  FT_Pos y_local;
  FT_Pos x_local;
  CFF_Builder *builder_local;
  
  local_24 = 0;
  if (builder->path_begun == '\0') {
    builder->path_begun = '\x01';
    local_24 = cff_builder_add_contour(builder);
    if (local_24 == 0) {
      local_24 = cff_builder_add_point1(builder,x,y);
    }
  }
  return local_24;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  cff_builder_start_point( CFF_Builder*  builder,
                           FT_Pos        x,
                           FT_Pos        y )
  {
    FT_Error  error = FT_Err_Ok;


    /* test whether we are building a new contour */
    if ( !builder->path_begun )
    {
      builder->path_begun = 1;
      error = cff_builder_add_contour( builder );
      if ( !error )
        error = cff_builder_add_point1( builder, x, y );
    }

    return error;
  }